

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O1

int __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::shutdown(dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
           *this,int __fd,int __how)

{
  _Base_ptr p_Var1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  this->m_shutdown_started = true;
  for (p_Var3 = (this->m_agent_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_agent_threads)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    p_Var1 = p_Var3[1]._M_parent;
    LOCK();
    *(undefined4 *)&p_Var1->_M_parent = 0;
    UNLOCK();
    reuse::work_thread::demand_queue_details::
    queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
    ::stop_service((queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
                    *)&p_Var1->_M_left);
  }
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return iVar2;
}

Assistant:

virtual void
		shutdown() override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				// During the shutdown new threads will not be created.
				m_shutdown_started = true;

				std::for_each(
					m_agent_threads.begin(),
					m_agent_threads.end(),
					call_shutdown< typename agent_thread_map_t::value_type > );
			}